

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmRange.h
# Opt level: O2

void __thiscall
RangeIterators::
FilterIterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Tests/CMakeLib/testRange.cxx:36:3)>
::SatisfyPredicate(FilterIterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_micst[P]CMake_Tests_CMakeLib_testRange_cxx:36:3)>
                   *this)

{
  byte *pbVar1;
  
  pbVar1 = (byte *)(this->Cur)._M_current;
  while ((pbVar1 != (byte *)(this->End)._M_current && ((*pbVar1 & 1) != 0))) {
    pbVar1 = pbVar1 + 4;
    (this->Cur)._M_current = (int *)pbVar1;
  }
  return;
}

Assistant:

void SatisfyPredicate()
  {
    while (this->Cur != this->End && !this->Pred(*this->Cur)) {
      ++this->Cur;
    }
  }